

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O1

void string_in_out_testing_v2
               (string *base_path,string *problem_no,list<int,_std::allocator<int>_> *files_to_run,
               _func_void *code_to_execute)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  char *pcVar9;
  undefined8 *puVar10;
  _List_node_base *p_Var11;
  long lVar12;
  uint uVar13;
  size_type *psVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong uVar19;
  uint __uval;
  uint uVar20;
  char cVar21;
  undefined8 uVar22;
  _Alloc_hider _Var23;
  uint uVar24;
  uint uVar25;
  string f_no;
  string in_no_comment_name;
  string ending;
  string out_name;
  string in_name;
  string __str_2;
  string exp_name;
  string path;
  string __str;
  ofstream out_file;
  string files_count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  string local_588;
  ulong *local_568;
  long local_560;
  ulong local_558;
  long lStack_550;
  uint local_548;
  uint local_544;
  string local_540;
  string local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  string local_4e0;
  ulong local_4c0;
  string local_4b8;
  long local_498;
  long local_490;
  ulong *local_488;
  long local_480;
  ulong local_478 [2];
  _func_void *local_468;
  undefined8 local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_458;
  _List_node_base *local_450;
  string *local_448;
  _List_node_base *local_440;
  undefined1 local_438 [8];
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [14];
  ios_base local_340 [264];
  string local_238 [16];
  
  local_468 = code_to_execute;
  lVar7 = std::chrono::_V2::system_clock::now();
  pcVar1 = (base_path->_M_dataplus)._M_p;
  local_438 = (undefined1  [8])local_428;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_438,pcVar1,pcVar1 + base_path->_M_string_length);
  std::__cxx11::string::append((char *)local_438);
  plVar8 = (long *)std::__cxx11::string::_M_append(local_438,(ulong)(problem_no->_M_dataplus)._M_p);
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  psVar14 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_238[0].field_2._0_8_ = *psVar14;
    local_238[0].field_2._8_8_ = plVar8[3];
  }
  else {
    local_238[0].field_2._0_8_ = *psVar14;
    local_238[0]._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_238[0]._M_string_length = plVar8[1];
  *plVar8 = (long)psVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)local_238);
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  psVar14 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_4b8.field_2._M_allocated_capacity = *psVar14;
    local_4b8.field_2._8_8_ = plVar8[3];
  }
  else {
    local_4b8.field_2._M_allocated_capacity = *psVar14;
    local_4b8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_4b8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p);
  }
  if (local_438 != (undefined1  [8])local_428) {
    operator_delete((void *)local_438);
  }
  local_498 = lVar7;
  local_448 = problem_no;
  if ((files_to_run->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
      super__List_node_base._M_next == (_List_node_base *)files_to_run) {
    search_in_and_exp_files(&local_4b8,files_to_run);
  }
  local_458 = _VTT;
  local_460 = _memcpy;
  local_490 = 0;
  local_548 = 0;
  local_4c0 = 0;
  local_450 = (_List_node_base *)files_to_run;
  do {
    p_Var11 = (((_List_base<int,_std::allocator<int>_> *)&((_List_node_base *)files_to_run)->_M_next
               )->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var11 == local_450) break;
    uVar20 = *(uint *)&p_Var11[1]._M_next;
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    local_5a8._M_string_length = 0;
    local_5a8.field_2._M_allocated_capacity =
         local_5a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_568 = &local_558;
    local_560 = 0;
    local_558 = local_558 & 0xffffffffffffff00;
    local_520._M_string_length = 0;
    local_520.field_2._M_allocated_capacity =
         local_520.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_540._M_string_length = 0;
    local_540.field_2._M_allocated_capacity =
         local_540.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_4e0._M_string_length = 0;
    local_4e0.field_2._M_allocated_capacity =
         local_4e0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_544 = -uVar20;
    if (0 < (int)uVar20) {
      local_544 = uVar20;
    }
    uVar24 = 1;
    if (9 < local_544) {
      uVar15 = (ulong)local_544;
      uVar25 = 4;
      do {
        uVar24 = uVar25;
        uVar5 = (uint)uVar15;
        if (uVar5 < 100) {
          uVar24 = uVar24 - 2;
          goto LAB_00107b1d;
        }
        if (uVar5 < 1000) {
          uVar24 = uVar24 - 1;
          goto LAB_00107b1d;
        }
        if (uVar5 < 10000) goto LAB_00107b1d;
        uVar15 = uVar15 / 10000;
        uVar25 = uVar24 + 4;
      } while (99999 < uVar5);
      uVar24 = uVar24 + 1;
    }
LAB_00107b1d:
    cVar21 = (char)((int)uVar20 >> 0x1f);
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    local_440 = p_Var11;
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_238,(char)uVar24 - cVar21);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_238[0]._M_dataplus._M_p + (uVar20 >> 0x1f),uVar24,local_544);
    std::__cxx11::string::operator=((string *)&local_5a8,(string *)local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p);
    }
    pcVar9 = (char *)std::__cxx11::string::_M_append
                               ((char *)&local_568,(ulong)local_5a8._M_dataplus._M_p);
    std::__cxx11::string::append(pcVar9);
    pcVar9 = (char *)std::__cxx11::string::_M_append
                               ((char *)&local_520,(ulong)local_4b8._M_dataplus._M_p);
    pcVar9 = (char *)std::__cxx11::string::append(pcVar9);
    std::__cxx11::string::_M_append(pcVar9,(ulong)local_568);
    pcVar9 = (char *)std::__cxx11::string::_M_append
                               ((char *)&local_540,(ulong)local_4b8._M_dataplus._M_p);
    pcVar9 = (char *)std::__cxx11::string::append(pcVar9);
    std::__cxx11::string::_M_append(pcVar9,(ulong)local_568);
    pcVar9 = (char *)std::__cxx11::string::_M_append
                               ((char *)&local_4e0,(ulong)local_4b8._M_dataplus._M_p);
    pcVar9 = (char *)std::__cxx11::string::append(pcVar9);
    std::__cxx11::string::_M_append(pcVar9,(ulong)local_568);
    std::operator+(&local_500,"\n",local_448);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
    uVar24 = local_544;
    puVar16 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_588.field_2._M_allocated_capacity = *puVar16;
      local_588.field_2._8_8_ = puVar10[3];
      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
    }
    else {
      local_588.field_2._M_allocated_capacity = *puVar16;
      local_588._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_588._M_string_length = puVar10[1];
    *puVar10 = puVar16;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    uVar25 = 1;
    if (9 < local_544) {
      uVar5 = local_544;
      uVar13 = 4;
      do {
        uVar25 = uVar13;
        if (uVar5 < 100) {
          uVar25 = uVar25 - 2;
          goto LAB_00107d38;
        }
        if (uVar5 < 1000) {
          uVar25 = uVar25 - 1;
          goto LAB_00107d38;
        }
        if (uVar5 < 10000) goto LAB_00107d38;
        bVar4 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        uVar13 = uVar25 + 4;
      } while (bVar4);
      uVar25 = uVar25 + 1;
    }
LAB_00107d38:
    local_488 = local_478;
    std::__cxx11::string::_M_construct((ulong)&local_488,(char)uVar25 - cVar21);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_488 + (ulong)(uVar20 >> 0x1f)),uVar25,uVar24);
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      uVar22 = local_588.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_480 + local_588._M_string_length) {
      uVar15 = 0xf;
      if (local_488 != local_478) {
        uVar15 = local_478[0];
      }
      if (uVar15 < local_480 + local_588._M_string_length) goto LAB_00107dc8;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_488,0,(char *)0x0,(ulong)local_588._M_dataplus._M_p);
    }
    else {
LAB_00107dc8:
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_588,(ulong)local_488);
    }
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 == paVar18) {
      local_428[0]._0_8_ = paVar18->_M_allocated_capacity;
      local_428[0]._8_8_ = puVar10[3];
      local_438 = (undefined1  [8])local_428;
    }
    else {
      local_428[0]._0_8_ = paVar18->_M_allocated_capacity;
      local_438 = (undefined1  [8])*puVar10;
    }
    local_430 = puVar10[1];
    *puVar10 = paVar18;
    puVar10[1] = 0;
    paVar18->_M_local_buf[0] = '\0';
    puVar10 = (undefined8 *)std::__cxx11::string::append(local_438);
    psVar14 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_238[0].field_2._0_8_ = *psVar14;
      local_238[0].field_2._8_8_ = puVar10[3];
      local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    }
    else {
      local_238[0].field_2._0_8_ = *psVar14;
      local_238[0]._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_238[0]._M_string_length = puVar10[1];
    *puVar10 = psVar14;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    write_colored_text(local_238,blue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p);
    }
    if (local_438 != (undefined1  [8])local_428) {
      operator_delete((void *)local_438);
    }
    if (local_488 != local_478) {
      operator_delete(local_488);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p);
    }
    create_file_with_removed_comments(&local_588,&local_520);
    if (local_588._M_string_length == 0) {
      bVar4 = false;
    }
    else {
      std::ifstream::ifstream(local_238,(string *)&local_588,_S_in);
      bVar4 = problem_with_file_to_read((ifstream *)local_238,&local_588);
      if (bVar4) {
        bVar4 = false;
      }
      else {
        std::ofstream::ofstream((ofstream *)local_438,(string *)&local_540,_S_out);
        bVar4 = problem_with_file_to_write((ofstream *)local_438,&local_540);
        if (bVar4) {
          bVar4 = false;
        }
        else {
          std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
          std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
          lVar7 = std::chrono::_V2::system_clock::now();
          (*local_468)();
          lVar12 = std::chrono::_V2::system_clock::now();
          std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
          std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"code: ",6);
          lVar7 = (lVar12 - lVar7) / 1000;
          print_time(lVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...  ",5);
          std::ofstream::close();
          std::ifstream::close();
          remove_a_file(&local_588);
          iVar6 = execute_tests(&local_540,&local_4e0);
          local_490 = local_490 + lVar7;
          bVar4 = iVar6 != -9999;
          if (bVar4) {
            bVar2 = 0 < iVar6;
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            local_548 = local_548 + iVar6;
            local_4c0 = (ulong)((int)local_4c0 + (uint)bVar2);
          }
        }
        local_438 = (undefined1  [8])local_458;
        *(undefined8 *)(local_438 + *(size_type *)(local_458->_M_local_buf + -0x18)) = local_460;
        std::filebuf::~filebuf((filebuf *)&local_430);
        std::ios_base::~ios_base(local_340);
      }
      std::ifstream::~ifstream(local_238);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p);
    }
    if (local_568 != &local_558) {
      operator_delete(local_568);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    files_to_run = (list<int,_std::allocator<int>_> *)local_440;
    p_Var11 = local_440;
  } while (bVar4);
  uVar15 = local_4c0;
  if (p_Var11 != local_450) goto LAB_00108888;
  uVar19 = (ulong)local_450[1]._M_next;
  cVar21 = '\x01';
  if (9 < uVar19) {
    uVar17 = uVar19;
    cVar3 = '\x04';
    do {
      cVar21 = cVar3;
      if (uVar17 < 100) {
        cVar21 = cVar21 + -2;
        goto LAB_00108257;
      }
      if (uVar17 < 1000) {
        cVar21 = cVar21 + -1;
        goto LAB_00108257;
      }
      if (uVar17 < 10000) goto LAB_00108257;
      bVar4 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      cVar3 = cVar21 + '\x04';
    } while (bVar4);
    cVar21 = cVar21 + '\x01';
  }
LAB_00108257:
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct((ulong)local_238,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_238[0]._M_dataplus._M_p,(uint)local_238[0]._M_string_length,uVar19);
  uVar20 = (uint)uVar15;
  if (uVar20 == 0) {
    std::operator+(&local_5a8,"\n-> Hurray, all ",local_238);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_5a8);
    lVar7 = local_498;
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 == paVar18) {
      local_428[0]._0_8_ = paVar18->_M_allocated_capacity;
      local_428[0]._8_8_ = puVar10[3];
      local_438 = (undefined1  [8])local_428;
    }
    else {
      local_428[0]._0_8_ = paVar18->_M_allocated_capacity;
      local_438 = (undefined1  [8])*puVar10;
    }
    local_430 = puVar10[1];
    *puVar10 = paVar18;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    write_colored_text((string *)local_438,cyan);
    if (local_438 != (undefined1  [8])local_428) {
      operator_delete((void *)local_438);
    }
    _Var23._M_p = local_5a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) goto LAB_001087be;
  }
  else {
    uVar24 = -uVar20;
    if (0 < (int)uVar20) {
      uVar24 = uVar20;
    }
    uVar25 = 1;
    if (9 < uVar24) {
      uVar19 = (ulong)uVar24;
      uVar5 = 4;
      do {
        uVar25 = uVar5;
        uVar13 = (uint)uVar19;
        if (uVar13 < 100) {
          uVar25 = uVar25 - 2;
          goto LAB_001083af;
        }
        if (uVar13 < 1000) {
          uVar25 = uVar25 - 1;
          goto LAB_001083af;
        }
        if (uVar13 < 10000) goto LAB_001083af;
        uVar19 = uVar19 / 10000;
        uVar5 = uVar25 + 4;
      } while (99999 < uVar13);
      uVar25 = uVar25 + 1;
    }
LAB_001083af:
    local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_588,(char)uVar25 - ((char)(uVar15 >> 0x18) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_588._M_dataplus._M_p + (uVar20 >> 0x1f),uVar25,uVar24);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_588,0,(char *)0x0,0x119477);
    puVar16 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_4e0.field_2._M_allocated_capacity = *puVar16;
      local_4e0.field_2._8_8_ = plVar8[3];
      local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    }
    else {
      local_4e0.field_2._M_allocated_capacity = *puVar16;
      local_4e0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_4e0._M_string_length = plVar8[1];
    *plVar8 = (long)puVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_4e0);
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    puVar16 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_540.field_2._M_allocated_capacity = *puVar16;
      local_540.field_2._8_8_ = plVar8[3];
    }
    else {
      local_540.field_2._M_allocated_capacity = *puVar16;
      local_540._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_540._M_string_length = plVar8[1];
    *plVar8 = (long)puVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_540,(ulong)local_238[0]._M_dataplus._M_p);
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    puVar16 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_520.field_2._M_allocated_capacity = *puVar16;
      local_520.field_2._8_8_ = plVar8[3];
    }
    else {
      local_520.field_2._M_allocated_capacity = *puVar16;
      local_520._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_520._M_string_length = plVar8[1];
    *plVar8 = (long)puVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_520);
    puVar16 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar16) {
      local_558 = *puVar16;
      lStack_550 = plVar8[3];
      local_568 = &local_558;
    }
    else {
      local_558 = *puVar16;
      local_568 = (ulong *)*plVar8;
    }
    local_560 = plVar8[1];
    *plVar8 = (long)puVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    uVar20 = -local_548;
    if (0 < (int)local_548) {
      uVar20 = local_548;
    }
    uVar24 = 1;
    if (9 < uVar20) {
      uVar15 = (ulong)uVar20;
      uVar25 = 4;
      do {
        uVar24 = uVar25;
        uVar5 = (uint)uVar15;
        if (uVar5 < 100) {
          uVar24 = uVar24 - 2;
          goto LAB_001085c5;
        }
        if (uVar5 < 1000) {
          uVar24 = uVar24 - 1;
          goto LAB_001085c5;
        }
        if (uVar5 < 10000) goto LAB_001085c5;
        uVar15 = uVar15 / 10000;
        uVar25 = uVar24 + 4;
      } while (99999 < uVar5);
      uVar24 = uVar24 + 1;
    }
LAB_001085c5:
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_500,(char)uVar24);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_500._M_dataplus._M_p,uVar24,uVar20);
    uVar15 = 0xf;
    if (local_568 != &local_558) {
      uVar15 = local_558;
    }
    if (uVar15 < local_500._M_string_length + local_560) {
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._M_dataplus._M_p != &local_500.field_2) {
        uVar22 = local_500.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < local_500._M_string_length + local_560) goto LAB_00108643;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_500,0,(char *)0x0,(ulong)local_568);
    }
    else {
LAB_00108643:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_568,(ulong)local_500._M_dataplus._M_p);
    }
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    puVar16 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_5a8.field_2._M_allocated_capacity = *puVar16;
      local_5a8.field_2._8_8_ = puVar10[3];
    }
    else {
      local_5a8.field_2._M_allocated_capacity = *puVar16;
      local_5a8._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_5a8._M_string_length = puVar10[1];
    *puVar10 = puVar16;
    puVar10[1] = 0;
    *(undefined1 *)puVar16 = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_5a8);
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 == paVar18) {
      local_428[0]._0_8_ = paVar18->_M_allocated_capacity;
      local_428[0]._8_8_ = puVar10[3];
      local_438 = (undefined1  [8])local_428;
    }
    else {
      local_428[0]._0_8_ = paVar18->_M_allocated_capacity;
      local_438 = (undefined1  [8])*puVar10;
    }
    local_430 = puVar10[1];
    *puVar10 = paVar18;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    write_colored_text((string *)local_438,red);
    if (local_438 != (undefined1  [8])local_428) {
      operator_delete((void *)local_438);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p);
    }
    if (local_568 != &local_558) {
      operator_delete(local_568);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p);
    }
    _Var23._M_p = local_588._M_dataplus._M_p;
    lVar7 = local_498;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
LAB_001087be:
      operator_delete(_Var23._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Total code execution: ",0x18);
  print_time(local_490);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,", total overall time: ",0x16);
  lVar12 = std::chrono::_V2::system_clock::now();
  print_time((lVar12 - lVar7) / 1000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p);
  }
LAB_00108888:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void string_in_out_testing_v2(const string &base_path,
                              const string &problem_no,
                              list<int> &files_to_run,
                              void (*code_to_execute)()) {

    auto start_all = chrono::high_resolution_clock::now();

    string path = base_path + "/in_out_exp_files/" + problem_no + "/";

    // If no files were provided, then search the directory for in1.txt, in2.txt  and exp1.txt, exp2.txt and so on:
    if (files_to_run.empty()) search_in_and_exp_files(path, files_to_run);


    int file_count_failed = 0;
    int total_errors = 0;
    long int total_runtime = 0;

    for (int file_no : files_to_run) {
        // Note: Simple string concatenation would work:
//        path = path + problem_no + "/";
        // But since this concatenation is now inside a loop, CLion suggests:
        //     Clang-Tidy: String concatenation results in_file allocation of unnecessary temporary strings; consider 
        //     using 'operator+=' or 'string::append()' instead
        // See also https://www.w3schools.com/cpp/cpp_strings_concat.asp for a short explanation
        // NOTE: Strings are automatically initialized to "".
        string f_no, ending, in_name, out_name, exp_name;
        f_no = to_string(file_no);
        ending.append(f_no).append(".txt");
        in_name.append(path).append("in").append(ending);
        out_name.append(path).append("out").append(ending);
        exp_name.append(path).append("exp").append(ending);

        write_colored_text("\n" + problem_no + ", file-nr " + to_string(file_no) + "...  ", blue);

        // Creating file with removed comments in in_file:
        string in_no_comment_name = create_file_with_removed_comments(in_name);
        if (in_no_comment_name.empty()) return;

        // Open the files:
        ifstream in_no_comment_file(in_no_comment_name);
        if (problem_with_file_to_read(in_no_comment_file, in_no_comment_name)) return;
        ofstream out_file(out_name);
        if (problem_with_file_to_write(out_file, out_name)) return;


        // Switching cin (stdin) to read from file in_name and switching cout (stdout) to write to file out_name:
        streambuf *cin_buf = cin.rdbuf(in_no_comment_file.rdbuf()); // Save old buf and redirect cin to in_file.txt
        streambuf *cout_buf = cout.rdbuf(out_file.rdbuf()); // Save old buf and redirect cout to out_file.txt

        // Start the code timer:
        auto start = chrono::high_resolution_clock::now();

        // Execute passed in_file code (now using the changed cin and cout):
        code_to_execute();

        // Stop the timer:
        auto stop = chrono::high_resolution_clock::now();

        // Recreate the standard output to the terminal:
        cin.rdbuf(cin_buf);   // Reset to standard input again
        cout.rdbuf(cout_buf); // Reset to standard output again

        // Subtract stop and start time-points and cast it to required unit with duration_cast() function: 
        // Predefined units are: nanoseconds, microseconds, milliseconds, seconds, minutes, hours.
        long int micro = chrono::duration_cast<chrono::microseconds>(stop - start).count();
        cout << "code: ";
        print_time(micro);
        cout << "...  ";
        total_runtime += micro;
        // Close out_file (was open for write access - but in the tests, its needed for read-access)
        out_file.close();

        // Remove the file without comments
        in_no_comment_file.close();
        remove_a_file(in_no_comment_name);


        // Execute the tests:
        int error_count = execute_tests(out_name, exp_name);
        if (error_count == -9999) return; // abort if error in execute_tests(..) occurred
        else if (error_count > 0) {
            file_count_failed++;
            total_errors += error_count;
        }
    }

    string files_count = to_string(files_to_run.size());

    if (file_count_failed == 0) {
        write_colored_text("\n-> Hurray, all " + files_count + " provided tests passed!", cyan);
    } else {
        write_colored_text(
                "\n-> " + to_string(file_count_failed) + " of " + files_count +
                " provided tests failed with a total of " + to_string(total_errors) + " wrong lines.", red);
    }
    cout << "  Total code execution: ";
    print_time(total_runtime);
    cout << ", total overall time: ";
    auto stop_all = chrono::high_resolution_clock::now();
    long int micro_all = chrono::duration_cast<chrono::microseconds>(stop_all - start_all).count();
    print_time(micro_all);
    cout << "." << endl;

}